

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Session::Session(Session *this)

{
  unique_ptr<Catch::IStream> this_00;
  bool bVar1;
  int iVar2;
  ReusableStringStream *pRVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  Context *this_01;
  Config *config;
  IStream *pIVar5;
  ColourImpl *pCVar6;
  undefined4 extraout_var_00;
  ostream *poVar7;
  undefined1 auVar8 [12];
  Parser local_1a0 [2];
  exception *ex;
  reference local_d0;
  exception_ptr *ex_ptr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *__range2;
  ColourGuard guard;
  unique_ptr<Catch::ColourImpl> colourImpl;
  string local_90;
  unique_ptr<Catch::IStream> local_70;
  unique_ptr<Catch::IStream> errStream;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *exceptions;
  ReusableStringStream local_50;
  string local_40;
  undefined4 local_1c;
  undefined8 local_18;
  Session *local_10;
  Session *this_local;
  
  local_10 = this;
  Clara::Parser::Parser(&this->m_cli);
  ConfigData::ConfigData(&this->m_configData);
  Detail::unique_ptr<Catch::Config>::unique_ptr(&this->m_config,(nullptr_t)0x0);
  this->m_startupExceptions = false;
  if ((Session::alreadyInstantiated & 1U) != 0) {
    ReusableStringStream::ReusableStringStream(&local_50);
    SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)&exceptions,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
               ,0x476);
    pRVar3 = ReusableStringStream::operator<<(&local_50,(SourceLineInfo *)&exceptions);
    pRVar3 = ReusableStringStream::operator<<(pRVar3,(char (*) [26])": Internal Catch2 error: ");
    pRVar3 = ReusableStringStream::operator<<
                       (pRVar3,(char (*) [53])"Only one instance of Catch::Session can ever be used"
                       );
    ReusableStringStream::str_abi_cxx11_(&local_40,pRVar3);
    throw_logic_error(&local_40);
  }
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[6])();
  errStream.m_ptr =
       (IStream *)
       StartupExceptionRegistry::getExceptions
                 ((StartupExceptionRegistry *)CONCAT44(extraout_var,iVar2));
  bVar1 = std::
          vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
          ::empty((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                   *)errStream.m_ptr);
  if (!bVar1) {
    Session::config(this);
    this_01 = getCurrentMutableContext();
    config = Detail::unique_ptr<Catch::Config>::get(&this->m_config);
    Context::setConfig(this_01,&config->super_IConfig);
    this->m_startupExceptions = true;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"%stderr",(allocator<char> *)((long)&colourImpl.m_ptr + 7));
    makeStream((Catch *)&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&colourImpl.m_ptr + 7));
    pIVar5 = Detail::unique_ptr<Catch::IStream>::get(&local_70);
    makeColourImpl((Catch *)&guard.m_code,PlatformDefault,pIVar5);
    pCVar6 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                       ((unique_ptr<Catch::ColourImpl> *)&guard.m_code);
    ColourImpl::guardColour((ColourImpl *)&__range2,(Code)pCVar6);
    pIVar5 = Detail::unique_ptr<Catch::IStream>::operator->(&local_70);
    iVar2 = (*pIVar5->_vptr_IStream[2])();
    poVar7 = std::operator<<((ostream *)CONCAT44(extraout_var_00,iVar2),
                             "Errors occurred during startup!");
    std::operator<<(poVar7,'\n');
    this_00 = errStream;
    __end2 = std::
             vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
             ::begin((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                      *)errStream.m_ptr);
    ex_ptr = (exception_ptr *)
             std::
             vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
             ::end((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                    *)this_00.m_ptr);
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                                *)&ex_ptr);
    if (bVar1) {
      local_d0 = __gnu_cxx::
                 __normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                 ::operator*(&__end2);
      std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)&ex,local_d0);
      auVar8 = std::rethrow_exception((exception_ptr)&ex);
      local_1c = auVar8._8_4_;
      local_18 = auVar8._0_8_;
      std::allocator<char>::~allocator((allocator<char> *)((long)&colourImpl.m_ptr + 7));
      Detail::unique_ptr<Catch::Config>::~unique_ptr(&this->m_config);
      ConfigData::~ConfigData(&this->m_configData);
      Clara::Parser::~Parser(&this->m_cli);
      _Unwind_Resume(local_18);
    }
    ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&__range2);
    Detail::unique_ptr<Catch::ColourImpl>::~unique_ptr
              ((unique_ptr<Catch::ColourImpl> *)&guard.m_code);
    Detail::unique_ptr<Catch::IStream>::~unique_ptr(&local_70);
  }
  Session::alreadyInstantiated = true;
  makeCommandLineParser(local_1a0,&this->m_configData);
  Clara::Parser::operator=(&this->m_cli,local_1a0);
  Clara::Parser::~Parser(local_1a0);
  return;
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if( alreadyInstantiated ) {
            CATCH_TRY { CATCH_INTERNAL_ERROR( "Only one instance of Catch::Session can ever be used" ); }
            CATCH_CATCH_ALL { getMutableRegistryHub().registerStartupException(); }